

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void * producer_fun(void *params)

{
  bool bVar1;
  bool flag;
  uint64_t *num;
  Object obj;
  Bucket *bucket;
  void *params_local;
  
  obj.addr = (uint8_t *)FastQueue::enqueue(fastqueue);
  Object::Object((Object *)&num,data,0x40);
  do {
    while( true ) {
      bVar1 = Bucket::store((Bucket *)obj.addr,(Object *)&num);
      if (bVar1) break;
      Bucket::releaseBucket((Bucket *)obj.addr);
      obj.addr = (uint8_t *)FastQueue::enqueue(fastqueue);
    }
    *(long *)params = *params + 1;
  } while( true );
}

Assistant:

void* producer_fun(void* params){

    Bucket* bucket = fastqueue->enqueue();
    Object obj(data, (int)DATA_LEN);
    
    uint64_t* num = (uint64_t*)params;
    bool flag;

    while(true){
        flag = bucket->store(obj);
        if(!flag){
            bucket->releaseBucket();
            bucket = fastqueue->enqueue();
            continue;
        }
	    (*num)++;
    }
   
}